

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrMultisamplePixelBufferAccess.cpp
# Opt level: O0

ConstPixelBufferAccess * __thiscall
rr::MultisampleConstPixelBufferAccess::toSinglesampleAccess
          (ConstPixelBufferAccess *__return_storage_ptr__,MultisampleConstPixelBufferAccess *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  TextureFormat *format;
  void *data;
  Vector<int,_3> local_30;
  Vector<int,_3> local_24;
  MultisampleConstPixelBufferAccess *local_18;
  MultisampleConstPixelBufferAccess *this_local;
  
  local_18 = this;
  this_local = (MultisampleConstPixelBufferAccess *)__return_storage_ptr__;
  format = tcu::ConstPixelBufferAccess::getFormat(&this->m_access);
  iVar1 = tcu::ConstPixelBufferAccess::getHeight(&this->m_access);
  iVar2 = tcu::ConstPixelBufferAccess::getDepth(&this->m_access);
  tcu::Vector<int,_3>::Vector(&local_24,iVar1,iVar2,1);
  iVar1 = tcu::ConstPixelBufferAccess::getRowPitch(&this->m_access);
  iVar2 = tcu::ConstPixelBufferAccess::getSlicePitch(&this->m_access);
  iVar3 = tcu::ConstPixelBufferAccess::getSlicePitch(&this->m_access);
  iVar4 = tcu::ConstPixelBufferAccess::getDepth(&this->m_access);
  tcu::Vector<int,_3>::Vector(&local_30,iVar1,iVar2,iVar3 * iVar4);
  data = tcu::ConstPixelBufferAccess::getDataPtr(&this->m_access);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (__return_storage_ptr__,format,&local_24,&local_30,data);
  return __return_storage_ptr__;
}

Assistant:

const tcu::ConstPixelBufferAccess MultisampleConstPixelBufferAccess::toSinglesampleAccess (void) const
{
	DE_ASSERT(getNumSamples() == 1);

	return tcu::ConstPixelBufferAccess(m_access.getFormat(),
									   tcu::IVec3(m_access.getHeight(), m_access.getDepth(), 1),
									   tcu::IVec3(m_access.getRowPitch(), m_access.getSlicePitch(), m_access.getSlicePitch() * m_access.getDepth()),
									   m_access.getDataPtr());
}